

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

int cmExecuteCommand(void *arg,char *name,int numArgs,char **args)

{
  bool bVar1;
  cmExecutionStatus local_ec;
  int local_e8;
  cmExecutionStatus status;
  int local_e0;
  int i;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  cmListFileFunction lff;
  cmMakefile *mf;
  char **args_local;
  int numArgs_local;
  char *name_local;
  void *arg_local;
  
  lff.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)arg;
  cmListFileFunction::cmListFileFunction((cmListFileFunction *)local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,name,&local_c9);
  cmCommandContext::cmCommandName::operator=((cmCommandName *)local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  for (local_e0 = 0; local_e0 < numArgs; local_e0 = local_e0 + 1) {
    status.ReturnInvoked = true;
    status.BreakInvoked = false;
    status.ContinueInvoked = false;
    status.NestedError = false;
    local_e8 = 0;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
               &lff.super_cmCommandContext.EndCol,args + local_e0,(Delimiter *)&status,&local_e8);
  }
  cmExecutionStatus::cmExecutionStatus(&local_ec);
  bVar1 = cmMakefile::ExecuteCommand
                    ((cmMakefile *)
                     lff.Arguments.
                     super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (cmListFileFunction *)local_a8,&local_ec);
  cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_a8);
  return (uint)bVar1;
}

Assistant:

int CCONV cmExecuteCommand(void* arg, const char* name, int numArgs,
                           const char** args)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmListFileFunction lff;
  lff.Name = name;
  for (int i = 0; i < numArgs; ++i) {
    // Assume all arguments are quoted.
    lff.Arguments.emplace_back(args[i], cmListFileArgument::Quoted, 0);
  }
  cmExecutionStatus status;
  return mf->ExecuteCommand(lff, status);
}